

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void show_allocate(CHAR_DATA *ch,int finish)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int iVar3;
  int iVar4;
  char buf [4608];
  undefined4 in_stack_ffffffffffffedbc;
  int in_stack_ffffffffffffedc4;
  undefined4 in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedcc;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  char local_1228 [4616];
  long local_20;
  
  local_20 = in_RDI;
  if (in_ESI == 0) {
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                    ,(char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                    in_stack_ffffffffffffedc4);
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                    ,(char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                    in_stack_ffffffffffffedc4);
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                    ,(char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                    in_stack_ffffffffffffedc4);
    write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                    ,(char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                    in_stack_ffffffffffffedc4);
  }
  sprintf(local_1228,"You have %d points to allocate.\n\r",
          (ulong)(uint)(int)*(short *)(local_20 + 0x1fc));
  write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                  (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                  in_stack_ffffffffffffedc4);
  iVar2 = (int)*(short *)(local_20 + 0x26e);
  iVar4 = (int)pc_race_table[*(short *)(local_20 + 0x136)].max_stats[3];
  iVar3 = (int)*(short *)(local_20 + 0x270);
  iVar1 = (int)pc_race_table[*(short *)(local_20 + 0x136)].max_stats[4];
  sprintf(local_1228,
          "Your stats: Str: %d (Max %d)  Int: %d (Max %d)  Wis: %d (Max %d)  Dex: %d (Max %d)  Con: %d (Max %d)\n\r"
          ,(ulong)(uint)(int)*(short *)(local_20 + 0x268),
          (ulong)(uint)(int)pc_race_table[*(short *)(local_20 + 0x136)].max_stats[0],
          (ulong)(uint)(int)*(short *)(local_20 + 0x26a),
          (ulong)(uint)(int)pc_race_table[*(short *)(local_20 + 0x136)].max_stats[1],
          (int)*(short *)(local_20 + 0x26c),
          (int)pc_race_table[*(short *)(local_20 + 0x136)].max_stats[2]);
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffedc4,iVar4),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,iVar2));
  write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,iVar1),
                  (char *)CONCAT44(in_stack_ffffffffffffedcc,iVar3),in_stack_ffffffffffffedc4);
  return;
}

Assistant:

void show_allocate(CHAR_DATA *ch, int finish)
{
	char buf[MSL];

	if (!finish)
	{
		write_to_buffer(ch->desc, "Type '<str/int/wis/dex/con> <amount>' to modify a particular stat.\n\r", 0);
		write_to_buffer(ch->desc, "The default amount is 1, use negative numbers to deallocate points.\n\r", 0);
		write_to_buffer(ch->desc, "Type 'finish' when you're done.\n\r", 0);
		write_to_buffer(ch->desc, "\n\rTime to allocate points to your stats.\n\r", 0);
	}

	sprintf(buf, "You have %d points to allocate.\n\r", ch->train);
	write_to_buffer(ch->desc, buf, 0);

	sprintf(buf, "Your stats: Str: %d (Max %d)  Int: %d (Max %d)  Wis: %d (Max %d)  Dex: %d (Max %d)  Con: %d (Max %d)\n\r",
		ch->perm_stat[STAT_STR],
		pc_race_table[ch->race].max_stats[STAT_STR],
		ch->perm_stat[STAT_INT],
		pc_race_table[ch->race].max_stats[STAT_INT],
		ch->perm_stat[STAT_WIS],
		pc_race_table[ch->race].max_stats[STAT_WIS],
		ch->perm_stat[STAT_DEX],
		pc_race_table[ch->race].max_stats[STAT_DEX],
		ch->perm_stat[STAT_CON],
		pc_race_table[ch->race].max_stats[STAT_CON]);
	send_to_char(buf, ch);

	write_to_buffer(ch->desc, "> ", 0);
}